

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_enc_sigpass_step(opj_t1_t *t1,flag_t *flagsp,int *datap,int orient,int bpno,int one,
                        int *nmsedec,char type,int vsc)

{
  opj_mqc_t *mqc_00;
  char cVar1;
  short sVar2;
  uint uVar3;
  int x;
  int in_ECX;
  int *in_RDX;
  ushort *in_RSI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  int *in_stack_00000008;
  char in_stack_00000010;
  int in_stack_00000018;
  opj_mqc_t *mqc;
  int flag;
  int v;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar4;
  uint local_3c;
  
  mqc_00 = *(opj_mqc_t **)(in_RDI + 8);
  if (in_stack_00000018 == 0) {
    local_3c = (uint)(short)*in_RSI;
  }
  else {
    local_3c = (int)(short)*in_RSI & 0xfffffbb9;
  }
  if (((local_3c & 0xff) != 0) && ((local_3c & 0x5000) == 0)) {
    uVar3 = int_abs(*in_RDX);
    uVar3 = (uint)((uVar3 & in_R9D) != 0);
    cVar1 = t1_getctxno_zc(local_3c,in_ECX);
    mqc_00->curctx = mqc_00->ctxs + (int)cVar1;
    if (in_stack_00000010 == '\x01') {
      mqc_bypass_enc(mqc_00,uVar3);
    }
    else {
      mqc_encode((opj_mqc_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    }
    if (uVar3 != 0) {
      uVar3 = (uint)(*in_RDX < 0);
      x = int_abs(*in_RDX);
      sVar2 = t1_getnmsedec_sig(x,in_R8D + 6);
      *in_stack_00000008 = (int)sVar2 + *in_stack_00000008;
      cVar1 = t1_getctxno_sc(local_3c);
      mqc_00->curctx = mqc_00->ctxs + (int)cVar1;
      if (in_stack_00000010 == '\x01') {
        mqc_bypass_enc(mqc_00,uVar3);
      }
      else {
        uVar4 = uVar3;
        t1_getspb(local_3c);
        mqc_encode((opj_mqc_t *)CONCAT44(uVar4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c)
        ;
      }
      t1_updateflags((flag_t *)in_RSI,uVar3,*(int *)(in_RDI + 0x38));
    }
    *in_RSI = *in_RSI | 0x4000;
  }
  return;
}

Assistant:

static void t1_enc_sigpass_step(
		opj_t1_t *t1,
		flag_t *flagsp,
		int *datap,
		int orient,
		int bpno,
		int one,
		int *nmsedec,
		char type,
		int vsc)
{
	int v, flag;
	
	opj_mqc_t *mqc = t1->mqc;	/* MQC component */
	
	flag = vsc ? ((*flagsp) & (~(T1_SIG_S | T1_SIG_SE | T1_SIG_SW | T1_SGN_S))) : (*flagsp);
	if ((flag & T1_SIG_OTH) && !(flag & (T1_SIG | T1_VISIT))) {
		v = int_abs(*datap) & one ? 1 : 0;
		mqc_setcurctx(mqc, t1_getctxno_zc(flag, orient));	/* ESSAI */
		if (type == T1_TYPE_RAW) {	/* BYPASS/LAZY MODE */
			mqc_bypass_enc(mqc, v);
		} else {
			mqc_encode(mqc, v);
		}
		if (v) {
			v = *datap < 0 ? 1 : 0;
			*nmsedec +=	t1_getnmsedec_sig(int_abs(*datap), bpno + T1_NMSEDEC_FRACBITS);
			mqc_setcurctx(mqc, t1_getctxno_sc(flag));	/* ESSAI */
			if (type == T1_TYPE_RAW) {	/* BYPASS/LAZY MODE */
				mqc_bypass_enc(mqc, v);
			} else {
				mqc_encode(mqc, v ^ t1_getspb(flag));
			}
			t1_updateflags(flagsp, v, t1->flags_stride);
		}
		*flagsp |= T1_VISIT;
	}
}